

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssllabs.cpp
# Opt level: O1

int __thiscall ssllabs::SSLlabs::curl_read(SSLlabs *this,string *command,string *data)

{
  CURLcode CVar1;
  SSLlabs *pSVar2;
  SSLlabs *pSVar3;
  string url;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  pSVar2 = (SSLlabs *)curl_easy_init();
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"https://api.ssllabs.com/api/v2","");
  std::__cxx11::string::_M_append((char *)local_50,(ulong)(command->_M_dataplus)._M_p);
  if (pSVar2 == (SSLlabs *)0x0) {
    CVar1 = CURLE_OK;
  }
  else {
    pSVar3 = pSVar2;
    CVar1 = curl_easy_setopt(pSVar2,0x4e2b,writeCallback);
    verifyCurlStatus(pSVar3,CVar1);
    pSVar3 = pSVar2;
    CVar1 = curl_easy_setopt(pSVar2,0x2711,data);
    verifyCurlStatus(pSVar3,CVar1);
    pSVar3 = pSVar2;
    CVar1 = curl_easy_setopt(pSVar2,0x2b,1);
    verifyCurlStatus(pSVar3,CVar1);
    pSVar3 = pSVar2;
    CVar1 = curl_easy_setopt(pSVar2,0x34,1);
    verifyCurlStatus(pSVar3,CVar1);
    pSVar3 = pSVar2;
    CVar1 = curl_easy_setopt(pSVar2,0xd,this->timeout);
    verifyCurlStatus(pSVar3,CVar1);
    pSVar3 = pSVar2;
    CVar1 = curl_easy_setopt(pSVar2,0x2722,"libssllabs/1.0");
    verifyCurlStatus(pSVar3,CVar1);
    pSVar3 = pSVar2;
    CVar1 = curl_easy_setopt(pSVar2,0x2712,local_50[0]);
    verifyCurlStatus(pSVar3,CVar1);
    pSVar3 = pSVar2;
    CVar1 = curl_easy_setopt(pSVar2,0x20,6);
    verifyCurlStatus(pSVar3,CVar1);
    pSVar3 = pSVar2;
    CVar1 = curl_easy_perform();
    verifyCurlStatus(pSVar3,CVar1);
    curl_easy_cleanup(pSVar2);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  return CVar1;
}

Assistant:

int SSLlabs::curl_read(const std::string &command, const std::string &data) {
        CURLcode code(CURLE_OK);
        CURL *curl = curl_easy_init();
        std::string url(SSLLABS_API_URL);

        url += command;

        if (curl) {
            code = curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION, &writeCallback);
            verifyCurlStatus(code);

            code = curl_easy_setopt(curl, CURLOPT_WRITEDATA, (void *) &data);
            verifyCurlStatus(code);

            code = curl_easy_setopt(curl, CURLOPT_NOPROGRESS, 1L);
            verifyCurlStatus(code);

            code = curl_easy_setopt(curl, CURLOPT_FOLLOWLOCATION, 1L);
            verifyCurlStatus(code);

            code = curl_easy_setopt(curl, CURLOPT_TIMEOUT, timeout);
            verifyCurlStatus(code);

            code = curl_easy_setopt(curl, CURLOPT_USERAGENT, SSLLABS_AGENT);
            verifyCurlStatus(code);

            code = curl_easy_setopt(curl, CURLOPT_URL, url.c_str());
            verifyCurlStatus(code);

            code = curl_easy_setopt(curl, CURLOPT_SSLVERSION, CURL_SSLVERSION_TLSv1_2);
            verifyCurlStatus(code);

            code = curl_easy_perform(curl);
            verifyCurlStatus(code);
            
            curl_easy_cleanup(curl);
        }

        return code;
    }